

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O3

void __thiscall VertexAttrib64Bit::ApiErrorsTest::invalidOperation(ApiErrorsTest *this,bool *result)

{
  void *pvVar1;
  GLenum err;
  ostream *poVar2;
  long lVar3;
  stringstream message;
  long *local_1d8;
  long local_1c8 [2];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  lVar3 = 0;
  (*(this->super_Base).gl.bindBuffer)(0x8892,0);
  err = (*(this->super_Base).gl.getError)();
  glu::checkError(err,"BindBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0x1b5);
  do {
    pvVar1 = *(void **)((long)invalidOperation::pointer_array + lVar3);
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"VertexAttribLPointer(..., ",0x1a);
    poVar2 = std::ostream::_M_insert<void_const*>((ostream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," /* pointer */)",0xf);
    (*(this->super_Base).gl.vertexAttribLPointer)(1,4,0x140a,0,pvVar1);
    std::__cxx11::stringbuf::str();
    verifyError(this,0x502,(char *)local_1d8,0x1bf,result);
    if (local_1d8 != local_1c8) {
      operator_delete(local_1d8,local_1c8[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x18);
  return;
}

Assistant:

void ApiErrorsTest::invalidOperation(bool& result)
{

	/*
	 *e) GL_INVALID_OPERATION should be generated by glVertexAttribLPointer()
	 *   if zero is bound to the GL_ARRAY_BUFFER buffer object binding
	 *   point and the <pointer> argument is not NULL.
	 */
	static const GLvoid* pointer_array[]	  = { (GLvoid*)1, (GLvoid*)4, (GLvoid*)-16 };
	static const GLuint  pointer_array_length = sizeof(pointer_array) / sizeof(pointer_array[0]);

	gl.bindBuffer(GL_ARRAY_BUFFER, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindBuffer");

	for (GLuint i = 0; i < pointer_array_length; ++i)
	{
		const GLvoid* pointer = pointer_array[i];

		std::stringstream message;
		message << "VertexAttribLPointer(..., " << pointer << " /* pointer */)";

		gl.vertexAttribLPointer(1 /* index */, 4 /*size */, GL_DOUBLE, 0 /* stride */, pointer);
		verifyError(GL_INVALID_OPERATION, message.str().c_str(), __LINE__, result);
	}
}